

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decahedron.cpp
# Opt level: O0

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Decahedron::truncatedRing(Decahedron *this,int n,int k)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  Vector<double,_3U> *in_RDI;
  int j_1;
  int j;
  Vector3d b2;
  Vector3d b1;
  int i;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *ring;
  Vector<double,_3U> *in_stack_fffffffffffffe78;
  Vector<double,_3U> *in_stack_fffffffffffffe80;
  Vector<double,_3U> *pVVar1;
  undefined4 local_e4;
  undefined4 local_64;
  undefined4 local_20;
  
  pVVar1 = in_RDI;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x2bb30c)
  ;
  for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RSI + 0x30),(long)local_20);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffe80,
               (Vector3<double> *)in_stack_fffffffffffffe78);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RSI + 0x30),(long)(local_20 + 1 + ((local_20 + 1) / 5) * -5));
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffe80,
               (Vector3<double> *)in_stack_fffffffffffffe78);
    local_e4 = in_ECX;
    if (in_ECX == 0) {
      for (local_64 = 0; local_64 < in_EDX; local_64 = local_64 + 1) {
        OpenMD::operator*((double)in_RDI,in_stack_fffffffffffffe80);
        in_stack_fffffffffffffe80 = (Vector<double,_3U> *)(double)local_64;
        OpenMD::operator-(in_RDI,in_stack_fffffffffffffe80);
        OpenMD::operator*((double)in_RDI,in_stack_fffffffffffffe80);
        OpenMD::operator+(in_RDI,in_stack_fffffffffffffe80);
        Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
      }
    }
    else {
      for (; local_e4 <= in_EDX - in_ECX; local_e4 = local_e4 + 1) {
        OpenMD::operator*((double)in_RDI,in_stack_fffffffffffffe80);
        in_stack_fffffffffffffe78 = (Vector<double,_3U> *)(double)local_e4;
        OpenMD::operator-(in_RDI,in_stack_fffffffffffffe80);
        OpenMD::operator*((double)in_RDI,in_stack_fffffffffffffe80);
        OpenMD::operator+(in_RDI,in_stack_fffffffffffffe80);
        Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
      }
    }
  }
  return (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)pVVar1;
}

Assistant:

vector<Vector3d> Decahedron::truncatedRing(int n, int k) {
    // This function generates the rings of a Decahedron
    // n: index of shell (order of ring)
    // k: how many atoms are missing from both ends of one side of
    //    pentagon ring

    vector<Vector3d> ring;

    // Generate atomic coordinates along each side of pentagonal ring
    for (int i = 0; i < 5; i++) {
      Vector3d b1 = Basis[i];
      Vector3d b2 = Basis[(i + 1) % 5];

      if (k == 0) {
        // without truncation
        for (int j = 0; j < n; j++) {
          ring.push_back(RealType(n) * b1 + RealType(j) * (b2 - b1));
        }

      } else {
        for (int j = k; j <= n - k; j++) {
          // with truncation
          ring.push_back(RealType(n) * b1 + RealType(j) * (b2 - b1));
        }
      }
    }
    return ring;
  }